

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

void __thiscall SQCompiler::TryCatchStatement(SQCompiler *this)

{
  SQScope *pSVar1;
  long *plVar2;
  SQUnsignedInteger SVar3;
  long lVar4;
  long lVar5;
  SQUnsignedInteger SVar6;
  SQInteger SVar7;
  SQInteger SVar8;
  SQInteger SVar9;
  SQFuncState *pSVar10;
  SQObject SVar11;
  SQScope __oldscope__;
  SQScope __oldscope___1;
  
  Lex(this);
  SQFuncState::AddInstruction(this->_fs,_OP_PUSHTRAP,0,0,0,0);
  pSVar10 = this->_fs;
  pSVar10->_traps = pSVar10->_traps + 1;
  SVar3 = (pSVar10->_breaktargets)._size;
  if (SVar3 != 0) {
    plVar2 = (pSVar10->_breaktargets)._vals + (SVar3 - 1);
    *plVar2 = *plVar2 + 1;
  }
  SVar3 = (pSVar10->_continuetargets)._size;
  if (SVar3 != 0) {
    plVar2 = (pSVar10->_continuetargets)._vals + (SVar3 - 1);
    *plVar2 = *plVar2 + 1;
  }
  SVar3 = (pSVar10->_instructions)._size;
  pSVar1 = &this->_scope;
  __oldscope__.outers = (this->_scope).outers;
  __oldscope__.stacksize = (this->_scope).stacksize;
  (this->_scope).outers = pSVar10->_outers;
  SVar8 = SQFuncState::GetStackSize(pSVar10);
  (this->_scope).stacksize = SVar8;
  Statement(this,true);
  lVar4 = this->_fs->_outers;
  SVar8 = SQFuncState::GetStackSize(this->_fs);
  pSVar10 = this->_fs;
  lVar5 = (this->_scope).stacksize;
  if (SVar8 != lVar5) {
    SQFuncState::SetStackSize(pSVar10,lVar5);
    pSVar10 = this->_fs;
    if (lVar4 != pSVar10->_outers) {
      SQFuncState::AddInstruction(pSVar10,_OP_CLOSE,0,(this->_scope).stacksize,0,0);
      pSVar10 = this->_fs;
    }
  }
  pSVar1->outers = __oldscope__.outers;
  (this->_scope).stacksize = __oldscope__.stacksize;
  pSVar10->_traps = pSVar10->_traps + -1;
  SQFuncState::AddInstruction(pSVar10,_OP_POPTRAP,1,0,0,0);
  pSVar10 = this->_fs;
  SVar6 = (pSVar10->_breaktargets)._size;
  if (SVar6 != 0) {
    plVar2 = (pSVar10->_breaktargets)._vals + (SVar6 - 1);
    *plVar2 = *plVar2 + -1;
  }
  lVar4 = SVar3 - 1;
  SVar6 = (pSVar10->_continuetargets)._size;
  if (SVar6 != 0) {
    plVar2 = (pSVar10->_continuetargets)._vals + (SVar6 - 1);
    *plVar2 = *plVar2 + -1;
  }
  SQFuncState::AddInstruction(pSVar10,_OP_JMP,0,0,0,0);
  SVar6 = (this->_fs->_instructions)._size;
  SQFuncState::SetInstructionParam(this->_fs,lVar4,1,SVar6 - SVar3);
  Expect(this,0x126);
  Expect(this,0x28);
  SVar11 = Expect(this,0x102);
  __oldscope__.stacksize = (SQInteger)SVar11._unVal;
  __oldscope__.outers = CONCAT44(__oldscope__.outers._4_4_,SVar11._type);
  Expect(this,0x29);
  SVar8 = pSVar1->outers;
  SVar7 = (this->_scope).stacksize;
  pSVar10 = this->_fs;
  (this->_scope).outers = pSVar10->_outers;
  SVar9 = SQFuncState::GetStackSize(pSVar10);
  (this->_scope).stacksize = SVar9;
  SVar9 = SQFuncState::PushLocalVariable(this->_fs,(SQObject *)&__oldscope__);
  SQFuncState::SetInstructionParam(this->_fs,lVar4,0,SVar9);
  Statement(this,true);
  SQFuncState::SetInstructionParams
            (this->_fs,SVar6 - 1,0,(this->_fs->_instructions)._size - SVar6,0,0);
  lVar4 = this->_fs->_outers;
  SVar9 = SQFuncState::GetStackSize(this->_fs);
  lVar5 = (this->_scope).stacksize;
  if (SVar9 != lVar5) {
    SQFuncState::SetStackSize(this->_fs,lVar5);
    if (lVar4 != this->_fs->_outers) {
      SQFuncState::AddInstruction(this->_fs,_OP_CLOSE,0,(this->_scope).stacksize,0,0);
    }
  }
  pSVar1->outers = SVar8;
  (this->_scope).stacksize = SVar7;
  return;
}

Assistant:

void TryCatchStatement()
    {
        SQObject exid;
        Lex();
        _fs->AddInstruction(_OP_PUSHTRAP,0,0);
        _fs->_traps++;
        if(_fs->_breaktargets.size()) _fs->_breaktargets.top()++;
        if(_fs->_continuetargets.size()) _fs->_continuetargets.top()++;
        SQInteger trappos = _fs->GetCurrentPos();
        {
            BEGIN_SCOPE();
            Statement();
            END_SCOPE();
        }
        _fs->_traps--;
        _fs->AddInstruction(_OP_POPTRAP, 1, 0);
        if(_fs->_breaktargets.size()) _fs->_breaktargets.top()--;
        if(_fs->_continuetargets.size()) _fs->_continuetargets.top()--;
        _fs->AddInstruction(_OP_JMP, 0, 0);
        SQInteger jmppos = _fs->GetCurrentPos();
        _fs->SetInstructionParam(trappos, 1, (_fs->GetCurrentPos() - trappos));
        Expect(TK_CATCH); Expect(_SC('(')); exid = Expect(TK_IDENTIFIER); Expect(_SC(')'));
        {
            BEGIN_SCOPE();
            SQInteger ex_target = _fs->PushLocalVariable(exid);
            _fs->SetInstructionParam(trappos, 0, ex_target);
            Statement();
            _fs->SetInstructionParams(jmppos, 0, (_fs->GetCurrentPos() - jmppos), 0);
            END_SCOPE();
        }
    }